

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O2

void __thiscall
BufferedFileTest_MoveFromTemporaryInCtor_Test::TestBody
          (BufferedFileTest_MoveFromTemporaryInCtor_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  buffered_file f;
  AssertionResult gtest_ar;
  FILE *fp;
  
  fp = (FILE *)0x0;
  open_buffered_file(&f.file_);
  local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)f.file_
  ;
  testing::internal::CmpHelperEQ<_IO_FILE*,_IO_FILE*>
            ((internal *)&gtest_ar,"fp","f.get()",&fp,(_IO_FILE **)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
               ,0x5f,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::buffered_file::~buffered_file(&f);
  return;
}

Assistant:

TEST(BufferedFileTest, MoveFromTemporaryInCtor) {
  FILE *fp = FMT_NULL;
  buffered_file f(open_buffered_file(&fp));
  EXPECT_EQ(fp, f.get());
}